

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_list.c
# Opt level: O1

int qc_staticlist_add_at(QcStaticList *staticList,int previous_cell,int cell)

{
  long lVar1;
  QcStaticList *pQVar2;
  char *buff;
  int iVar3;
  ulong uVar4;
  
  iVar3 = -1;
  if ((((-1 < previous_cell && staticList != (QcStaticList *)0x0) &&
       (previous_cell < staticList->limit)) && (cell < staticList->limit && -1 < cell)) &&
     (iVar3 = -99, staticList->head != -99)) {
    lVar1 = staticList->buff_offset;
    pQVar2 = (QcStaticList *)((long)&staticList->head + (ulong)(uint)cell * 8 + lVar1);
    uVar4 = (ulong)(uint)previous_cell;
    iVar3 = *(int *)((long)&staticList->tail + uVar4 * 8 + lVar1);
    if ((long)iVar3 == -99) {
      *(int *)((long)&staticList->tail + uVar4 * 8 + lVar1) = cell;
      pQVar2->head = previous_cell;
      pQVar2->tail = -99;
      pQVar2 = staticList;
      iVar3 = cell;
    }
    else {
      *(int *)((long)&staticList->tail + uVar4 * 8 + lVar1) = cell;
      *(int *)((long)&staticList->head + (long)iVar3 * 8 + lVar1) = cell;
      pQVar2->head = previous_cell;
    }
    pQVar2->tail = iVar3;
    staticList->num = staticList->num + 1;
    iVar3 = cell;
  }
  return iVar3;
}

Assistant:

int qc_staticlist_add_at(QcStaticList *staticList, int previous_cell, int cell)
{
    int next;
    _StaticCell *curCell, *preCell, *nextCell;

    if(NULL == staticList)
        return -1;

    if(previous_cell<0 || previous_cell>=staticList->limit)
        return -1;

    if(cell<0 || cell>=staticList->limit)
        return -1;

    if(staticList->head == QC_INVALID_INT)
        return QC_INVALID_INT;

    curCell = get_staticlist_cell(staticList, cell);
    preCell=get_staticlist_cell(staticList, previous_cell);
    next=preCell->next;

    if(next!= QC_INVALID_INT)
    {
       nextCell=get_staticlist_cell(staticList, next);
       preCell->next=cell;
       nextCell->previous=cell;
       curCell->previous=previous_cell;
       curCell->next=next;
    }
    else
    {
       preCell->next=cell;
       curCell->previous=previous_cell;
       curCell->next=QC_INVALID_INT;
       staticList->tail=cell;
    }
    staticList->num ++;

    return cell;
}